

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

SVInt __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::getValue(UnbasedUnsizedIntegerLiteral *this)

{
  char cVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar3;
  bool isSigned;
  bitwidth_t width;
  SVInt *tmp;
  undefined1 isSigned_00;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  Type *this_01;
  bitwidth_t bits;
  bitwidth_t in_stack_ffffffffffffffdc;
  undefined8 uVar2;
  
  this_01 = (Type *)&(in_RSI->super_SVIntStorage).bitWidth;
  this_00 = in_RDI;
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9efc32);
  isSigned_00 = in_RDI._7_1_;
  Type::getBitWidth(this_01);
  bits = (bitwidth_t)((ulong)this_01 >> 0x20);
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9efc48);
  Type::isSigned((Type *)this_00.pVal);
  cVar1 = *(char *)&in_RSI[3].super_SVIntStorage.field_0;
  if (cVar1 == '\0') {
    SVInt::SVInt(in_RSI,bits,this_00.val,(bool)isSigned_00);
    uVar2 = extraout_RDX;
  }
  else if (cVar1 == '\x01') {
    SVInt::SVInt(in_RSI,bits,this_00.val,(bool)isSigned_00);
    SVInt::setAllOnes(in_RSI);
    uVar2 = extraout_RDX_00;
  }
  else if (cVar1 == '@') {
    SVar3 = SVInt::createFillZ(in_stack_ffffffffffffffdc,false);
    uVar2 = SVar3.super_SVIntStorage._8_8_;
  }
  else {
    SVar3 = SVInt::createFillX(in_stack_ffffffffffffffdc,false);
    uVar2 = SVar3.super_SVIntStorage._8_8_;
  }
  SVar3.super_SVIntStorage.bitWidth = (int)uVar2;
  SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
  SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
  SVar3.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
  SVar3.super_SVIntStorage.field_0.val = this_00.val;
  return (SVInt)SVar3.super_SVIntStorage;
}

Assistant:

SVInt UnbasedUnsizedIntegerLiteral::getValue() const {
    bitwidth_t width = type->getBitWidth();
    bool isSigned = type->isSigned();

    switch (value.value) {
        case 0:
            return SVInt(width, 0, isSigned);
        case 1: {
            SVInt tmp(width, 0, isSigned);
            tmp.setAllOnes();
            return tmp;
        }
        case logic_t::X_VALUE:
            return SVInt::createFillX(width, isSigned);
        case logic_t::Z_VALUE:
            return SVInt::createFillZ(width, isSigned);
        default:
            SLANG_UNREACHABLE;
    }
}